

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

HitTmp __thiscall BasicContainer::treehit(BasicContainer *this,Ray *ray,treenode *node)

{
  bool bVar1;
  uint uVar2;
  HitTmp HVar3;
  undefined8 *local_a0;
  BasicPrimitive *local_98;
  undefined1 local_78 [8];
  HitTmp resr;
  undefined1 local_48 [8];
  HitTmp resl;
  bool t;
  float p;
  treenode *node_local;
  Ray *ray_local;
  BasicContainer *this_local;
  float local_10;
  
  if (node == (treenode *)0x0) {
    HitTmp::HitTmp((HitTmp *)&this_local);
  }
  else {
    bVar1 = AABox::intersect(&node->bound,ray);
    if (bVar1) {
      if (node->shape == (BasicPrimitive *)0x0) {
        HVar3 = treehit(this,ray,node->lc);
        local_48 = (undefined1  [8])HVar3.primitive;
        resl.primitive._0_4_ = HVar3.t;
        bVar1 = HitTmp::operator_cast_to_bool((HitTmp *)local_48);
        if (bVar1) {
          HVar3 = treehit(this,ray,node->rc);
          local_78 = (undefined1  [8])HVar3.primitive;
          resr.primitive._0_4_ = HVar3.t;
          bVar1 = HitTmp::operator_cast_to_bool((HitTmp *)local_78);
          if ((!bVar1) || (resl.primitive._0_4_ < resr.primitive._0_4_)) {
            local_a0 = (undefined8 *)local_48;
          }
          else {
            local_a0 = (undefined8 *)local_78;
          }
          this_local = (BasicContainer *)*local_a0;
          local_10 = (float)local_a0[1];
        }
        else {
          HVar3 = treehit(this,ray,node->rc);
          this_local = (BasicContainer *)HVar3.primitive;
          local_10 = HVar3.t;
        }
      }
      else {
        uVar2 = (*(node->shape->super_Primitive)._vptr_Primitive[3])
                          (node->shape,ray,&resl.field_0xc);
        resl.t._3_1_ = (byte)uVar2 & 1;
        if ((uVar2 & 1) == 0) {
          local_98 = (BasicPrimitive *)0x0;
        }
        else {
          local_98 = node->shape;
        }
        HitTmp::HitTmp((HitTmp *)&this_local,local_98,(float)resl._12_4_);
      }
    }
    else {
      HitTmp::HitTmp((HitTmp *)&this_local);
    }
  }
  HVar3.t = local_10;
  HVar3.primitive = (BasicPrimitive *)this_local;
  HVar3._12_4_ = 0;
  return HVar3;
}

Assistant:

HitTmp treehit(const Ray& ray, treenode* node) const {
		if (node == NULL) return HitTmp();
		if (!node->bound.intersect(ray)) return HitTmp();
		if (node->shape != NULL) {
			float p;
			bool t = node->shape->intersect(ray, p);
			return HitTmp(t? node->shape: NULL, p);
		}
		HitTmp resl = treehit(ray, node->lc);
		if (!resl) return treehit(ray, node->rc);
		HitTmp resr = treehit(ray, node->rc);
		return (!resr || resl.t < resr.t)? resl: resr;
	}